

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmEnumDefinition(ExpressionContext *ctx,VmModule *module,ExprEnumDefinition *node)

{
  VmValue *pVVar1;
  
  pVVar1 = anon_unknown.dwarf_11cad6::CreateVoid(module);
  pVVar1 = anon_unknown.dwarf_11cad6::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmEnumDefinition(ExpressionContext &ctx, VmModule *module, ExprEnumDefinition *node)
{
	return CheckType(ctx, node, CreateVoid(module));
}